

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

int32 rw::getMaxSupportedMaxAnisotropy(void)

{
  return 1;
}

Assistant:

int32
getMaxSupportedMaxAnisotropy(void)
{
#ifdef RW_D3D9
	return d3d::d3d9Globals.caps.MaxAnisotropy;
#endif
#ifdef RW_GL3
	return (int32)gl3::gl3Caps.maxAnisotropy;
#endif
	return 1;
}